

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::pumpTo(WebSocketPipeImpl *this,WebSocket *other)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> node;
  undefined8 uVar3;
  void *pvVar4;
  long *in_RDX;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode intermediate;
  OwnPromiseNode local_60;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_58;
  undefined1 local_50 [16];
  char *local_40;
  Maybe<kj::WebSocket_&> local_38;
  
  (**(code **)(*in_RDX + 0x28))(&local_60);
  OVar2.ptr = local_60.ptr;
  pPVar1 = ((local_60.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_60.ptr - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_60,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3918:45)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_0061ac10;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((local_60.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_60.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_60,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3918:45)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0061ac10;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_50._8_8_ = &DAT_0048a171;
  local_40 = "then";
  local_38.ptr = (WebSocket *)&DAT_4c0000058b;
  local_50._0_8_ = this_00;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_58,(OwnPromiseNode *)local_50,
             (SourceLocation *)(local_50 + 8));
  uVar3 = local_50._0_8_;
  if ((TransformPromiseNodeBase *)local_50._0_8_ != (TransformPromiseNodeBase *)0x0) {
    local_50._0_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  OVar2.ptr = local_60.ptr;
  if (&(local_60.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_60.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  pumpToNoAbort((WebSocketPipeImpl *)local_50,other);
  local_50._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_40 = "pumpTo";
  local_38.ptr = (WebSocket *)0xc00000f52;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)this,(OwnPromiseNode *)local_50,&local_58,
             (SourceLocation *)(local_50 + 8));
  uVar3 = local_50._0_8_;
  if ((TransformPromiseNodeBase *)local_50._0_8_ != (TransformPromiseNodeBase *)0x0) {
    local_50._0_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  node.ptr = local_58.ptr;
  if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
    auto onAbort = other.whenAborted().then([]() -> kj::Promise<void> {
      return KJ_EXCEPTION(DISCONNECTED, "WebSocket was aborted");
    });

    return pumpToNoAbort(other).exclusiveJoin(kj::mv(onAbort));
  }